

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object_class_test.cpp
# Opt level: O1

object hello_world_class_impl_interface_constructor
                 (klass cls,class_impl impl,char *name,constructor ctor,void **args,size_t size)

{
  undefined1 uVar1;
  undefined8 *puVar2;
  object poVar3;
  undefined8 uVar4;
  
  puVar2 = (undefined8 *)operator_new(0x10);
  *puVar2 = 0;
  puVar2[1] = 0;
  poVar3 = (object)object_create(name,0,puVar2,hello_world_object_impl_interface_singleton,cls);
  object_increment_reference(poVar3);
  if (args == (void **)0x0) {
    *(undefined1 *)puVar2 = 0x41;
    uVar4 = 0;
  }
  else {
    if (size != 2) {
      return poVar3;
    }
    uVar1 = value_to_char(*args);
    *(undefined1 *)puVar2 = uVar1;
    uVar4 = value_to_long(args[1]);
  }
  puVar2[1] = uVar4;
  return poVar3;
}

Assistant:

object hello_world_class_impl_interface_constructor(klass cls, class_impl impl, const char *name, constructor ctor, class_args args, size_t size)
{
	hello_world_object hello_world_obj = new hello_world_object_type();

	(void)impl;
	(void)ctor;

	object obj = object_create(name, ACCESSOR_TYPE_STATIC, hello_world_obj, &hello_world_object_impl_interface_singleton, cls);

	if (object_increment_reference(obj) != 0)
	{
		/* TODO: Abort? */
	}

	if (args == 0)
	{
		// Default constructor
		hello_world_obj->d = 'A';
		hello_world_obj->e = 0L;
	}
	else if (size == 2)
	{
		hello_world_obj->d = value_to_char(args[0]);
		hello_world_obj->e = value_to_long(args[1]);
	}

	return obj;
}